

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

void __thiscall CEditor::DoQuad(CEditor *this,CQuad *q,int Index)

{
  CPoint *pCVar1;
  CPoint *pCVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int v;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  byte bVar13;
  long lVar14;
  long in_FS_OFFSET;
  float fVar15;
  float fVar16;
  float fVar20;
  CPoint CVar17;
  CPoint CVar18;
  undefined1 auVar19 [16];
  ulong uVar21;
  CPoint CVar22;
  CPoint CVar23;
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 local_48;
  float local_40;
  float local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = q->m_aPoints + 4;
  uVar3 = (this->m_UI).m_MouseWorldX;
  uVar4 = (this->m_UI).m_MouseWorldY;
  fVar15 = (float)q->m_aPoints[4].x * 0.0009765625;
  fVar20 = (float)q->m_aPoints[4].y * 0.0009765625;
  fVar25 = (fVar15 - (float)uVar3) / this->m_WorldZoom;
  fVar16 = (fVar20 - (float)uVar4) / this->m_WorldZoom;
  if (fVar25 * fVar25 + fVar16 * fVar16 < 50.0) {
    (this->m_UI).m_pBecommingHotItem = pCVar1;
  }
  iVar8 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x162);
  bVar13 = 1;
  if ((char)iVar8 == '\0') {
    iVar8 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x166);
    bVar13 = (byte)iVar8;
  }
  if (this->m_SelectedQuad == Index) {
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
    local_40 = this->m_WorldZoom * 7.0;
    local_48 = CONCAT44(fVar20,fVar15);
    local_3c = local_40;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&local_48,1);
  }
  if ((CPoint *)(this->m_UI).m_pActiveItem == pCVar1) {
    (this->m_UI).m_ActiveItemValid = true;
    iVar8 = DoQuad::s_Operation;
    if (0.5 < this->m_MouseDeltaWx * this->m_MouseDeltaWx +
              this->m_MouseDeltaWy * this->m_MouseDeltaWy) {
      if (DoQuad::s_Operation == 1) {
        if ((byte)(bVar13 | this->m_GridActive ^ 1U) == 1) {
          lVar14 = 0;
          do {
            CVar23.x = q->m_aPoints[lVar14].x + (int)(((float)uVar3 - DoQuad::s_LastWx) * 1024.0);
            CVar23.y = q->m_aPoints[lVar14].y + (int)(((float)uVar4 - DoQuad::s_LastWy) * 1024.0);
            q->m_aPoints[lVar14] = CVar23;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 5);
        }
        else {
          uVar10 = this->m_ZoomLevel;
          uVar9 = 0x10;
          if ((((100 < (int)uVar10) && (uVar9 = 0x20, 0xfa < uVar10)) &&
              (uVar9 = 0x40, 0x1c2 < uVar10)) && (uVar9 = 0x80, 0x352 < uVar10)) {
            uVar9 = (uint)(0x60e < uVar10) * 0x100 + 0x100;
          }
          iVar8 = this->m_GridFactor;
          fVar16 = (float)(int)(iVar8 * (uVar9 >> 1));
          fVar25 = (float)(int)((uVar9 >> 1) * iVar8);
          auVar30._0_4_ =
               (float)((uint)-fVar16 & -(uint)((float)uVar3 < 0.0) |
                      ~-(uint)((float)uVar3 < 0.0) & (uint)fVar16) + (float)uVar3;
          auVar30._4_4_ =
               (float)((uint)-fVar25 & -(uint)((float)uVar4 < 0.0) |
                      ~-(uint)((float)uVar4 < 0.0) & (uint)fVar25) + (float)uVar4;
          auVar30._8_8_ = 0;
          auVar29._0_4_ = (float)(int)(iVar8 * uVar9);
          auVar29._4_4_ = (float)(int)(iVar8 * uVar9);
          auVar29._8_8_ = 0;
          auVar29 = divps(auVar30,auVar29);
          CVar18.x = (int)((float)(int)(iVar8 * uVar9 * (int)auVar29._0_4_) * 1024.0);
          CVar18.y = (int)((float)(int)((int)auVar29._4_4_ * iVar8 * uVar9) * 1024.0);
          iVar8 = CVar18.y - q->m_aPoints[4].y;
          iVar12 = CVar18.x - q->m_aPoints[4].x;
          q->m_aPoints[4] = CVar18;
          lVar14 = 0;
          do {
            pCVar1 = q->m_aPoints + lVar14;
            iVar5 = pCVar1->y;
            iVar6 = pCVar1[1].x;
            iVar7 = pCVar1[1].y;
            pCVar2 = q->m_aPoints + lVar14;
            pCVar2->x = pCVar1->x + iVar12;
            pCVar2->y = iVar5 + iVar8;
            pCVar2[1].x = iVar6 + iVar12;
            pCVar2[1].y = iVar7 + iVar8;
            lVar14 = lVar14 + 2;
          } while (lVar14 != 4);
        }
        iVar8 = 1;
      }
      else if (DoQuad::s_Operation == 2) {
        if (bVar13 == 0 && this->m_GridActive == true) {
          uVar10 = this->m_ZoomLevel;
          uVar9 = 0x10;
          if (((100 < (int)uVar10) && (uVar9 = 0x20, 0xfa < uVar10)) &&
             ((uVar9 = 0x40, 0x1c2 < uVar10 && (uVar9 = 0x80, 0x352 < uVar10)))) {
            uVar9 = (uint)(0x60e < uVar10) * 0x100 + 0x100;
          }
          iVar8 = this->m_GridFactor;
          fVar16 = (float)(int)(iVar8 * (uVar9 >> 1));
          fVar25 = (float)(int)((uVar9 >> 1) * iVar8);
          auVar28._0_4_ =
               (float)((uint)-fVar16 & -(uint)((float)uVar3 < 0.0) |
                      ~-(uint)((float)uVar3 < 0.0) & (uint)fVar16) + (float)uVar3;
          auVar28._4_4_ =
               (float)((uint)-fVar25 & -(uint)((float)uVar4 < 0.0) |
                      ~-(uint)((float)uVar4 < 0.0) & (uint)fVar25) + (float)uVar4;
          auVar28._8_8_ = 0;
          auVar26._0_4_ = (float)(int)(iVar8 * uVar9);
          auVar26._4_4_ = (float)(int)(iVar8 * uVar9);
          auVar26._8_8_ = 0;
          auVar29 = divps(auVar28,auVar26);
          CVar17.x = (int)((float)(int)(iVar8 * uVar9 * (int)auVar29._0_4_) * 1024.0);
          CVar17.y = (int)((float)(int)((int)auVar29._4_4_ * iVar8 * uVar9) * 1024.0);
          *pCVar1 = CVar17;
        }
        else {
          CVar22.x = (*pCVar1).x + (int)(((float)uVar3 - DoQuad::s_LastWx) * 1024.0);
          CVar22.y = (*pCVar1).y + (int)(((float)uVar4 - DoQuad::s_LastWy) * 1024.0);
          *pCVar1 = CVar22;
        }
        iVar8 = 2;
      }
      else if (DoQuad::s_Operation == 3) {
        lVar14 = 0;
        do {
          *(undefined8 *)((long)&q->m_aPoints[0].x + lVar14) =
               *(undefined8 *)((long)&DoQuad::s_RotatePoints[0].x + lVar14);
          Rotate(pCVar1,(CPoint *)((long)&q->m_aPoints[0].x + lVar14),DoQuad::s_RotateAngle);
          lVar14 = lVar14 + 8;
          iVar8 = DoQuad::s_Operation;
        } while (lVar14 != 0x20);
      }
    }
    DoQuad::s_RotateAngle = this->m_MouseDeltaX * 0.002 + DoQuad::s_RotateAngle;
    uVar10 = (this->m_UI).m_MouseButtons;
    if (iVar8 == 4) {
      DoQuad::s_LastWx = (float)uVar3;
      DoQuad::s_LastWy = (float)uVar4;
      if ((uVar10 & 2) == 0) {
        CUI::DoPopupMenu(&this->m_UI,(int)(this->m_UI).m_MouseX,(int)(this->m_UI).m_MouseY,0x78,0xb4
                         ,this,PopupQuad,0xf);
LAB_00196859:
        this->m_LockMouse = false;
        DoQuad::s_Operation = 0;
        (this->m_UI).m_ActiveItemValid = true;
        (this->m_UI).m_pActiveItem = (void *)0x0;
      }
    }
    else {
      DoQuad::s_LastWx = (float)uVar3;
      DoQuad::s_LastWy = (float)uVar4;
      if ((uVar10 & 1) == 0) goto LAB_00196859;
    }
    uVar10 = this->m_pConfig->m_EdColorQuadPivotActive;
  }
  else {
    if ((CPoint *)(this->m_UI).m_pHotItem == pCVar1) {
      uVar10 = this->m_pConfig->m_EdColorQuadPivotHover;
      uVar11 = uVar10 >> 8;
      ms_pUiGotContext = pCVar1;
      this->m_pTooltip =
           "Left mouse button to move. Hold shift to move pivot. Hold ctrl to rotate. Hold alt to ignore grid."
      ;
      uVar9 = (this->m_UI).m_MouseButtons;
      if ((uVar9 & 1) != 0) {
        iVar8 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x161);
        if (((char)iVar8 == '\0') &&
           (iVar8 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x165),
           (char)iVar8 == '\0')) {
          iVar8 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x160);
          if (((char)iVar8 == '\0') &&
             (iVar8 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])
                                (this->m_pInput,0x164), (char)iVar8 == '\0')) {
            DoQuad::s_Operation = 1;
          }
          else {
            this->m_LockMouse = true;
            DoQuad::s_Operation = 3;
            DoQuad::s_RotateAngle = 0.0;
            DoQuad::s_RotatePoints[0] = q->m_aPoints[0];
            DoQuad::s_RotatePoints[1] = q->m_aPoints[1];
            DoQuad::s_RotatePoints[2] = q->m_aPoints[2];
            DoQuad::s_RotatePoints[3] = q->m_aPoints[3];
          }
        }
        else {
          DoQuad::s_Operation = 2;
        }
        (this->m_UI).m_ActiveItemValid = true;
        (this->m_UI).m_pActiveItem = pCVar1;
        (this->m_UI).m_pLastActiveItem = pCVar1;
        if (this->m_SelectedQuad != Index) {
          this->m_SelectedPoints = 0;
        }
        this->m_SelectedQuad = Index;
        uVar9 = (this->m_UI).m_MouseButtons;
        DoQuad::s_LastWx = (float)uVar3;
        DoQuad::s_LastWy = (float)uVar4;
      }
      uVar21 = CONCAT44(uVar10 >> 0x10,uVar10 >> 0x18) & 0xffffffffff;
      if ((uVar9 & 2) != 0) {
        if (this->m_SelectedQuad != Index) {
          this->m_SelectedPoints = 0;
        }
        this->m_SelectedQuad = Index;
        DoQuad::s_Operation = 4;
        (this->m_UI).m_ActiveItemValid = true;
        (this->m_UI).m_pActiveItem = pCVar1;
        (this->m_UI).m_pLastActiveItem = pCVar1;
      }
      goto LAB_001968ab;
    }
    uVar10 = this->m_pConfig->m_EdColorQuadPivot;
  }
  uVar21 = CONCAT44(uVar10 >> 0x10,uVar10 >> 0x18) & 0xffffffffff;
  uVar11 = uVar10 >> 8;
LAB_001968ab:
  auVar24._0_8_ = uVar21 & 0xffffffff;
  auVar24._8_4_ = (int)(uVar21 >> 0x20);
  auVar24._12_4_ = 0;
  auVar19._0_4_ = (float)(SUB168(auVar24 | _DAT_001ddc00,0) - (double)DAT_001ddc00);
  auVar19._4_4_ = (float)(SUB168(auVar24 | _DAT_001ddc00,8) - DAT_001ddc00._8_8_);
  auVar19._8_8_ = 0;
  divps(auVar19,_DAT_001da050);
  auVar27._0_4_ = (float)(uVar11 & 0xff);
  auVar27._4_4_ = (float)(uVar10 & 0xff);
  auVar27._8_8_ = 0;
  divps(auVar27,_DAT_001da050);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])();
  local_40 = this->m_WorldZoom * 5.0;
  local_48 = CONCAT44(fVar20,fVar15);
  local_3c = local_40;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1c])(this->m_pGraphics,&local_48,1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::DoQuad(CQuad *q, int Index)
{
	enum
	{
		OP_NONE=0,
		OP_MOVE_ALL,
		OP_MOVE_PIVOT,
		OP_ROTATE,
		OP_CONTEXT_MENU,
	};

	// some basic values
	void *pID = &q->m_aPoints[4]; // use pivot addr as id
	static CPoint s_RotatePoints[4];
	static float s_LastWx;
	static float s_LastWy;
	static int s_Operation = OP_NONE;
	static float s_RotateAngle = 0;
	float wx = UI()->MouseWorldX();
	float wy = UI()->MouseWorldY();

	// get pivot
	float CenterX = fx2f(q->m_aPoints[4].x);
	float CenterY = fx2f(q->m_aPoints[4].y);

	float dx = (CenterX - wx)/m_WorldZoom;
	float dy = (CenterY - wy)/m_WorldZoom;
	if(dx*dx+dy*dy < 50)
		UI()->SetHotItem(pID);

	bool IgnoreGrid;
	if(Input()->KeyIsPressed(KEY_LALT) || Input()->KeyIsPressed(KEY_RALT))
		IgnoreGrid = true;
	else
		IgnoreGrid = false;

	// draw selection background
	if(m_SelectedQuad == Index)
	{
		Graphics()->SetColor(0,0,0,1);
		IGraphics::CQuadItem QuadItem(CenterX, CenterY, 7.0f*m_WorldZoom, 7.0f*m_WorldZoom);
		Graphics()->QuadsDraw(&QuadItem, 1);
	}

	vec4 PivotColor;

	if(UI()->CheckActiveItem(pID))
	{
		if(m_MouseDeltaWx*m_MouseDeltaWx+m_MouseDeltaWy*m_MouseDeltaWy > 0.5f)
		{
			// check if we only should move pivot
			if(s_Operation == OP_MOVE_PIVOT)
			{
				if(m_GridActive && !IgnoreGrid)
				{
					int LineDistance = GetLineDistance();

					float x = 0.0f;
					float y = 0.0f;
					if(wx >= 0)
						x = (int)((wx+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					else
						x = (int)((wx-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					if(wy >= 0)
						y = (int)((wy+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					else
						y = (int)((wy-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);

					q->m_aPoints[4].x = f2fx(x);
					q->m_aPoints[4].y = f2fx(y);
				}
				else
				{
					q->m_aPoints[4].x += f2fx(wx-s_LastWx);
					q->m_aPoints[4].y += f2fx(wy-s_LastWy);
				}
			}
			else if(s_Operation == OP_MOVE_ALL)
			{
				// move all points including pivot
				if(m_GridActive && !IgnoreGrid)
				{
					int LineDistance = GetLineDistance();

					float x = 0.0f;
					float y = 0.0f;
					if(wx >= 0)
						x = (int)((wx+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					else
						x = (int)((wx-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					if(wy >= 0)
						y = (int)((wy+(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);
					else
						y = (int)((wy-(LineDistance/2)*m_GridFactor)/(LineDistance*m_GridFactor)) * (LineDistance*m_GridFactor);

					int OldX = q->m_aPoints[4].x;
					int OldY = q->m_aPoints[4].y;
					q->m_aPoints[4].x = f2fx(x);
					q->m_aPoints[4].y = f2fx(y);
					int DiffX = q->m_aPoints[4].x - OldX;
					int DiffY = q->m_aPoints[4].y - OldY;

					for(int v = 0; v < 4; v++)
					{
						q->m_aPoints[v].x += DiffX;
						q->m_aPoints[v].y += DiffY;
					}
				}
				else
				{
					for(int v = 0; v < 5; v++)
					{
							q->m_aPoints[v].x += f2fx(wx-s_LastWx);
							q->m_aPoints[v].y += f2fx(wy-s_LastWy);
					}
				}
			}
			else if(s_Operation == OP_ROTATE)
			{
				for(int v = 0; v < 4; v++)
				{
					q->m_aPoints[v] = s_RotatePoints[v];
					Rotate(&q->m_aPoints[4], &q->m_aPoints[v], s_RotateAngle);
				}
			}
		}

		s_RotateAngle += (m_MouseDeltaX) * 0.002f;
		s_LastWx = wx;
		s_LastWy = wy;

		if(s_Operation == OP_CONTEXT_MENU)
		{
			if(!UI()->MouseButton(1))
			{
				UI()->DoPopupMenu(UI()->MouseX(), UI()->MouseY(), 120, 180, this, PopupQuad);
				m_LockMouse = false;
				s_Operation = OP_NONE;
				UI()->SetActiveItem(0);
			}
		}
		else
		{
			if(!UI()->MouseButton(0))
			{
				m_LockMouse = false;
				s_Operation = OP_NONE;
				UI()->SetActiveItem(0);
			}
		}

		PivotColor = HexToRgba(Config()->m_EdColorQuadPivotActive);
	}
	else if(UI()->HotItem() == pID)
	{
		ms_pUiGotContext = pID;

		PivotColor = HexToRgba(Config()->m_EdColorQuadPivotHover);
		m_pTooltip = "Left mouse button to move. Hold shift to move pivot. Hold ctrl to rotate. Hold alt to ignore grid.";

		if(UI()->MouseButton(0))
		{
			if(Input()->KeyIsPressed(KEY_LSHIFT) || Input()->KeyIsPressed(KEY_RSHIFT))
				s_Operation = OP_MOVE_PIVOT;
			else if(Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL))
			{
				m_LockMouse = true;
				s_Operation = OP_ROTATE;
				s_RotateAngle = 0;
				s_RotatePoints[0] = q->m_aPoints[0];
				s_RotatePoints[1] = q->m_aPoints[1];
				s_RotatePoints[2] = q->m_aPoints[2];
				s_RotatePoints[3] = q->m_aPoints[3];
			}
			else
				s_Operation = OP_MOVE_ALL;

			UI()->SetActiveItem(pID);
			if(m_SelectedQuad != Index)
				m_SelectedPoints = 0;
			m_SelectedQuad = Index;
			s_LastWx = wx;
			s_LastWy = wy;
		}

		if(UI()->MouseButton(1))
		{
			if(m_SelectedQuad != Index)
				m_SelectedPoints = 0;
			m_SelectedQuad = Index;
			s_Operation = OP_CONTEXT_MENU;
			UI()->SetActiveItem(pID);
		}
	}
	else
		PivotColor = HexToRgba(Config()->m_EdColorQuadPivot);

	Graphics()->SetColor(PivotColor.r, PivotColor.g, PivotColor.b, PivotColor.a);
	IGraphics::CQuadItem QuadItem(CenterX, CenterY, 5.0f*m_WorldZoom, 5.0f*m_WorldZoom);
	Graphics()->QuadsDraw(&QuadItem, 1);
}